

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O1

void soplex::MPSwriteRecord
               (ostream *os,char *indicator,char *name,SPxOut *spxout,char *name1,Rational *value1,
               char *name2,Rational *value2)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  Verbosity old_verbosity;
  char buf [81];
  Verbosity local_8c;
  char local_88 [88];
  
  lVar1 = std::ostream::tellp();
  if (indicator == (char *)0x0) {
    indicator = "";
  }
  if (name == (char *)0x0) {
    name = "";
  }
  spxSnprintf(local_88,0x51," %-2.2s %-8.8s",indicator,name);
  sVar2 = strlen(local_88);
  std::__ostream_insert<char,std::char_traits<char>>(os,local_88,sVar2);
  if (name1 != (char *)0x0) {
    spxSnprintf(local_88,0x51," %-8.8s ",name1);
    sVar2 = strlen(local_88);
    std::__ostream_insert<char,std::char_traits<char>>(os,local_88,sVar2);
    boost::multiprecision::operator<<(os,value1);
    if (name2 != (char *)0x0) {
      spxSnprintf(local_88,0x51," %-8.8s ",name2);
      sVar2 = strlen(local_88);
      std::__ostream_insert<char,std::char_traits<char>>(os,local_88,sVar2);
      boost::multiprecision::operator<<(os,value2);
    }
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  lVar3 = std::ostream::tellp();
  if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar3 - lVar1)) &&
     (local_8c = spxout->m_verbosity, 0 < (int)local_8c)) {
    (*spxout->_vptr_SPxOut[2])(spxout);
    std::__ostream_insert<char,std::char_traits<char>>
              (spxout->m_streams[spxout->m_verbosity],
               "XMPSWR04 Warning: SOPLEX_MAX_LINE_WRITE_LEN exceeded when writing MPS file\n",0x4b);
    (*spxout->_vptr_SPxOut[2])(spxout,&local_8c);
  }
  return;
}

Assistant:

static void MPSwriteRecord(
   std::ostream&  os,
   const char*    indicator,
   const char*    name,
   SPxOut* spxout,
   const char*    name1  = nullptr,
   const Rational value1 = 0,
   const char*    name2  = nullptr,
   const Rational value2 = 0
)
{
   char buf[81];
   long long pos;
   pos = os.tellp();

   spxSnprintf(buf, sizeof(buf), " %-2.2s %-8.8s", (indicator == nullptr) ? "" : indicator,
               (name == nullptr)      ? "" : name);
   os << buf;

   if(name1 != nullptr)
   {
      spxSnprintf(buf, sizeof(buf), " %-8.8s ", name1);
      os << buf << value1;

      if(name2 != nullptr)
      {
         spxSnprintf(buf, sizeof(buf), " %-8.8s ", name2);
         os << buf << value2;
      }
   }

   os << std::endl;

   // Warning if line is too long
   if((long long)(os.tellp()) - pos > SOPLEX_MAX_LINE_WRITE_LEN)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR04 Warning: SOPLEX_MAX_LINE_WRITE_LEN exceeded when writing MPS file\n");
   }
}